

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  int iVar5;
  uint uVar6;
  U32 UVar7;
  size_t sVar8;
  ulong uVar9;
  BYTE *pBVar10;
  int *piVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  int *iend;
  ulong uVar15;
  int *ip;
  long lVar16;
  U32 UVar17;
  size_t sVar18;
  uint uVar19;
  int *piVar20;
  seqDef *psVar21;
  size_t sVar22;
  uint local_d4;
  uint local_c0;
  size_t offsetFound;
  int *local_b0;
  int *local_a8;
  BYTE *local_a0;
  size_t local_98;
  BYTE *local_90;
  BYTE *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  ulong local_68;
  int *local_60;
  ZSTD_matchState_t *local_58;
  uint local_50;
  U32 local_4c;
  BYTE *local_48;
  seqStore_t *local_40;
  uint *local_38;
  
  iEnd = (int *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 8));
  local_a0 = (ms->window).base;
  local_88 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_68 = (ulong)(ms->window).lowLimit;
  local_90 = local_a0 + uVar2;
  local_70 = (int *)(local_88 + uVar2);
  local_48 = local_88 + local_68;
  ip = (int *)((ulong)(local_90 == (BYTE *)src) + (long)src);
  local_60 = (int *)((long)src + (srcSize - 0x20));
  local_d4 = *rep;
  local_c0 = rep[1];
  iVar5 = uVar2 - 1;
  piVar14 = (int *)src;
  local_58 = ms;
  local_40 = seqStore;
  local_38 = rep;
  piVar11 = local_78;
  do {
    while( true ) {
      local_a8 = piVar14;
      if (piVar11 <= ip) {
        *local_38 = local_d4;
        local_38[1] = local_c0;
        return (long)iEnd - (long)local_a8;
      }
      uVar19 = (int)ip - (int)local_a0;
      uVar6 = (uVar19 - local_d4) + 1;
      pBVar10 = local_88;
      if (uVar2 <= uVar6) {
        pBVar10 = local_a0;
      }
      if (((uint)local_68 < uVar6 && 2 < iVar5 - uVar6) &&
         (*(int *)((long)ip + 1) == *(int *)(pBVar10 + uVar6))) {
        piVar14 = local_70;
        if (uVar2 <= uVar6) {
          piVar14 = iEnd;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar10 + uVar6) + 4),(BYTE *)iEnd
                           ,(BYTE *)piVar14,local_90);
        uVar15 = sVar8 + 4;
      }
      else {
        uVar15 = 0;
      }
      offsetFound = 999999999;
      sVar8 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)ip,(BYTE *)iEnd,&offsetFound);
      uVar9 = uVar15;
      if (uVar15 < sVar8) {
        uVar9 = sVar8;
      }
      if (3 < uVar9) break;
      ip = (int *)((long)ip + ((long)ip - (long)local_a8 >> 8) + 1);
      piVar14 = local_a8;
    }
    piVar14 = ip;
    sVar18 = offsetFound;
    piVar20 = (int *)(ulong)uVar19;
    if (sVar8 <= uVar15) {
      piVar14 = (int *)((long)ip + 1);
      sVar18 = 0;
    }
    while (sVar22 = uVar9, iend = piVar14, sVar8 = sVar18, ip < piVar11) {
      local_b0 = (int *)((long)ip + 1);
      local_50 = (int)piVar20 + 1;
      local_80 = piVar14;
      if (sVar18 == 0) {
        sVar18 = 0;
      }
      else {
        uVar6 = local_50 - local_d4;
        pBVar10 = local_a0;
        if (uVar6 < uVar2) {
          pBVar10 = local_88;
        }
        if (((uint)local_68 < uVar6 && 2 < iVar5 - uVar6) &&
           (*local_b0 == *(int *)(pBVar10 + uVar6))) {
          piVar11 = iEnd;
          if (uVar6 < uVar2) {
            piVar11 = local_70;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar10 + uVar6) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar11,local_90);
          UVar7 = ZSTD_highbit32((int)sVar18 + 1);
          if ((sVar8 < 0xfffffffffffffffc) &&
             ((int)(((int)sVar22 * 3 - UVar7) + 1) < (int)(sVar8 + 4) * 3)) {
            local_80 = local_b0;
            sVar18 = 0;
            sVar22 = sVar8 + 4;
          }
        }
      }
      offsetFound = 999999999;
      uVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS
                        (local_58,(BYTE *)local_b0,(BYTE *)iEnd,&offsetFound);
      sVar8 = offsetFound;
      local_4c = ZSTD_highbit32((int)offsetFound + 1);
      UVar17 = (int)sVar18 + 1;
      local_98 = sVar18;
      UVar7 = ZSTD_highbit32(UVar17);
      if ((uVar9 < 4) || ((int)((int)uVar9 * 4 - local_4c) <= (int)(((int)sVar22 * 4 - UVar7) + 4)))
      {
        iend = local_80;
        sVar8 = local_98;
        if (local_78 <= local_b0) break;
        piVar14 = (int *)((long)ip + 2);
        uVar6 = (int)piVar20 + 2;
        local_b0 = (int *)(ulong)uVar6;
        if (local_98 == 0) {
          sVar8 = 0;
        }
        else {
          uVar6 = uVar6 - local_d4;
          pBVar10 = local_a0;
          if (uVar6 < uVar2) {
            pBVar10 = local_88;
          }
          if (((uint)local_68 < uVar6 && 2 < iVar5 - uVar6) &&
             (*piVar14 == *(int *)(pBVar10 + uVar6))) {
            piVar11 = iEnd;
            if (uVar6 < uVar2) {
              piVar11 = local_70;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)ip + 6),(BYTE *)((long)(pBVar10 + uVar6) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar11,local_90);
            UVar7 = ZSTD_highbit32(UVar17);
            sVar8 = local_98;
            if ((sVar18 < 0xfffffffffffffffc) &&
               ((int)(((int)sVar22 * 4 + 1) - UVar7) < (int)(sVar18 + 4) * 4)) {
              sVar8 = 0;
              sVar22 = sVar18 + 4;
              local_80 = piVar14;
            }
          }
        }
        offsetFound = 999999999;
        uVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS
                          (local_58,(BYTE *)piVar14,(BYTE *)iEnd,&offsetFound);
        sVar18 = offsetFound;
        UVar7 = ZSTD_highbit32((int)offsetFound + 1);
        UVar17 = ZSTD_highbit32((int)sVar8 + 1);
        iend = local_80;
        if ((uVar9 < 4) ||
           (ip = piVar14, piVar11 = local_78, piVar20 = local_b0,
           (int)((int)uVar9 * 4 - UVar7) <= (int)(((int)sVar22 * 4 - UVar17) + 7))) break;
      }
      else {
        piVar14 = local_b0;
        ip = local_b0;
        sVar18 = sVar8;
        piVar11 = local_78;
        piVar20 = (int *)(ulong)local_50;
      }
    }
    psVar4 = local_40;
    if (sVar8 == 0) {
      UVar7 = 1;
    }
    else {
      pBVar12 = (BYTE *)((long)iend + (-(long)local_a0 - sVar8) + 2);
      pBVar13 = local_90;
      pBVar10 = local_a0;
      if ((uint)pBVar12 < uVar2) {
        pBVar13 = local_48;
        pBVar10 = local_88;
      }
      pBVar10 = pBVar10 + ((ulong)pBVar12 & 0xffffffff);
      for (; ((local_a8 < iend && (pBVar13 < pBVar10)) &&
             (*(BYTE *)((long)iend + -1) == pBVar10[-1])); iend = (int *)((long)iend + -1)) {
        pBVar10 = pBVar10 + -1;
        sVar22 = sVar22 + 1;
      }
      UVar7 = (int)sVar8 + 1;
      local_c0 = local_d4;
      local_d4 = (int)sVar8 - 2;
    }
    if (local_40->maxNbSeq <=
        (ulong)((long)local_40->sequences - (long)local_40->sequencesStart >> 3)) {
LAB_00127cff:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_40->maxNbLit) {
LAB_00127d1e:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar15 = (long)iend - (long)local_a8;
    pBVar10 = local_40->lit;
    if (local_40->litStart + local_40->maxNbLit < pBVar10 + uVar15) {
LAB_00127cc1:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < iend) {
LAB_00127ce0:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_60 < iend) {
      ZSTD_safecopyLiterals(pBVar10,(BYTE *)local_a8,(BYTE *)iend,(BYTE *)local_60);
LAB_00127a28:
      psVar4->lit = psVar4->lit + uVar15;
      if (0xffff < uVar15) {
        if (psVar4->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar4->longLengthID = 1;
        psVar4->longLengthPos =
             (U32)((ulong)((long)psVar4->sequences - (long)psVar4->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_a8 + 2);
      *(undefined8 *)pBVar10 = *(undefined8 *)local_a8;
      *(undefined8 *)(pBVar10 + 8) = uVar3;
      pBVar10 = local_40->lit;
      if (0x10 < uVar15) {
        lVar16 = (long)(pBVar10 + 0x10) - (long)(local_a8 + 4);
        if (lVar16 < 8) {
          if (-0x10 < lVar16) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar16 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)(local_a8 + 6);
        *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(local_a8 + 4);
        *(undefined8 *)(pBVar10 + 0x18) = uVar3;
        if (0x20 < (long)uVar15) {
          lVar16 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_a8 + lVar16 + 0x20);
            uVar3 = puVar1[1];
            pBVar13 = pBVar10 + lVar16 + 0x20;
            *(undefined8 *)pBVar13 = *puVar1;
            *(undefined8 *)(pBVar13 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)local_a8 + lVar16 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar13 + 0x18) = uVar3;
            lVar16 = lVar16 + 0x20;
          } while (pBVar13 + 0x20 < pBVar10 + uVar15);
        }
        goto LAB_00127a28;
      }
      local_40->lit = pBVar10 + uVar15;
    }
    piVar11 = local_78;
    psVar21 = psVar4->sequences;
    psVar21->litLength = (U16)uVar15;
    psVar21->offset = UVar7;
    if (0xffff < sVar22 - 3) {
      if (psVar4->longLengthID != 0) {
LAB_00127d3d:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar4->longLengthID = 2;
      psVar4->longLengthPos = (U32)((ulong)((long)psVar21 - (long)psVar4->sequencesStart) >> 3);
    }
    psVar21->matchLength = (U16)(sVar22 - 3);
    psVar21 = psVar21 + 1;
    psVar4->sequences = psVar21;
    uVar6 = local_c0;
    for (ip = (int *)((long)iend + sVar22); local_c0 = uVar6, piVar14 = ip, ip <= piVar11;
        ip = (int *)((long)ip + sVar8 + 4)) {
      uVar6 = (uint)((long)ip - (long)(local_a0 + local_c0));
      pBVar10 = local_a0;
      if (uVar6 < uVar2) {
        pBVar10 = local_88;
      }
      if (((uVar6 <= (uint)local_68) || (iVar5 - uVar6 < 3)) ||
         (*ip != *(int *)(pBVar10 + ((long)ip - (long)(local_a0 + local_c0) & 0xffffffff)))) break;
      piVar14 = iEnd;
      if (uVar6 < uVar2) {
        piVar14 = local_70;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),
                         (BYTE *)((long)(pBVar10 +
                                        ((long)ip - (long)(local_a0 + local_c0) & 0xffffffff)) + 4),
                         (BYTE *)iEnd,(BYTE *)piVar14,local_90);
      if (psVar4->maxNbSeq <= (ulong)((long)psVar21 - (long)psVar4->sequencesStart >> 3))
      goto LAB_00127cff;
      if (0x20000 < psVar4->maxNbLit) goto LAB_00127d1e;
      pBVar10 = psVar4->lit;
      if (psVar4->litStart + psVar4->maxNbLit < pBVar10) goto LAB_00127cc1;
      if (iEnd < ip) goto LAB_00127ce0;
      if (local_60 < ip) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_60);
      }
      else {
        uVar3 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar10 + 8) = uVar3;
      }
      psVar21 = psVar4->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if (0xffff < sVar8 + 1) {
        if (psVar4->longLengthID != 0) goto LAB_00127d3d;
        psVar4->longLengthID = 2;
        psVar4->longLengthPos = (U32)((ulong)((long)psVar21 - (long)psVar4->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(sVar8 + 1);
      psVar21 = psVar21 + 1;
      psVar4->sequences = psVar21;
      uVar6 = local_d4;
      local_d4 = local_c0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}